

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefinitionsMap.h
# Opt level: O3

bool __thiscall
dg::dda::DefinitionsMap<dg::dda::RWNode>::
add<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
          (DefinitionsMap<dg::dda::RWNode> *this,DefSite *ds,
          set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
          *nodes)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  
  p_Var2 = (nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(nodes->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    do {
      bVar1 = add(this,ds,*(RWNode **)(p_Var2 + 1));
      bVar4 = (bool)(bVar4 | bVar1);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return bVar4;
}

Assistant:

bool add(const DefSite &ds, const ContainerT &nodes) {
        bool changed = false;
        for (auto *n : nodes)
            changed |= add(ds, n);
        return changed;
    }